

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR NpyArray::LoadNPZ(string *filename,npz_t *arrays)

{
  char *__filename;
  string *psVar1;
  int local_e4;
  LPCSTR ret;
  string varname;
  NpyArray arr;
  anon_class_8_1_3fcf6588 local_70;
  function<void_()> local_68;
  undefined1 local_48 [8];
  ScopeExitRun closeFp;
  FILE *fp;
  npz_t *arrays_local;
  string *filename_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  closeFp.functor._M_invoker = (_Invoker_type)fopen(__filename,"rb");
  if ((FILE *)closeFp.functor._M_invoker == (FILE *)0x0) {
    filename_local = (string *)anon_var_dwarf_174;
  }
  else {
    local_70.fp = (FILE **)&closeFp.functor._M_invoker;
    std::function<void()>::
    function<NpyArray::LoadNPZ(std::__cxx11::string,std::map<std::__cxx11::string,NpyArray,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>&)::__0,void>
              ((function<void()> *)&local_68,&local_70);
    TScopeExitRun<std::function<void_()>_>::TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)local_48,&local_68);
    std::function<void_()>::~function(&local_68);
    do {
      NpyArray((NpyArray *)((long)&varname.field_2 + 8));
      std::__cxx11::string::string((string *)&ret);
      psVar1 = (string *)
               LoadArrayNPZ((FILE *)closeFp.functor._M_invoker,(string *)&ret,
                            (NpyArray *)((long)&varname.field_2 + 8));
      if (psVar1 == (string *)0x1) {
        local_e4 = 3;
      }
      else if (psVar1 == (string *)0x0) {
        std::
        map<std::__cxx11::string,NpyArray,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>
        ::emplace<std::__cxx11::string&,NpyArray>
                  ((map<std::__cxx11::string,NpyArray,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>
                    *)arrays,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                   (NpyArray *)((long)&varname.field_2 + 8));
        local_e4 = 0;
      }
      else {
        local_e4 = 1;
        filename_local = psVar1;
      }
      std::__cxx11::string::~string((string *)&ret);
      ~NpyArray((NpyArray *)((long)&varname.field_2 + 8));
    } while (local_e4 == 0);
    if (local_e4 == 3) {
      filename_local = (string *)0x0;
    }
    TScopeExitRun<std::function<void_()>_>::~TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)local_48);
  }
  return (LPCSTR)filename_local;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(std::string filename, npz_t& arrays)
{
	FILE* fp = fopen(filename.c_str(), "rb");
	if (!fp)
		return "error: unable to open file";
	const ScopeExitRun closeFp([&]() { fclose(fp); });
	while (true) {
		NpyArray arr;
		std::string varname;
		const LPCSTR ret = LoadArrayNPZ(fp, varname, arr);
		if (ret == (const char*)1)
			break;
		if (ret != NULL)
			return ret;
		arrays.emplace(varname, std::move(arr));
	}
	return NULL;
}